

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_unary(ggml_compute_params *params,ggml_tensor *dst)

{
  uint uVar1;
  ggml_compute_params *params_00;
  ggml_compute_params *in_RSI;
  ggml_unary_op op;
  ggml_tensor *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar1 = ggml_get_unary_op(in_RSI);
  params_00 = (ggml_compute_params *)(ulong)uVar1;
  switch(params_00) {
  case (ggml_compute_params *)0x0:
    ggml_compute_forward_abs(params_00,in_stack_ffffffffffffffd8);
    break;
  case (ggml_compute_params *)0x1:
    ggml_compute_forward_sgn(params_00,in_stack_ffffffffffffffd8);
    break;
  case (ggml_compute_params *)0x2:
    ggml_compute_forward_neg(params_00,in_stack_ffffffffffffffd8);
    break;
  case (ggml_compute_params *)0x3:
    ggml_compute_forward_step(params_00,in_stack_ffffffffffffffd8);
    break;
  case (ggml_compute_params *)0x4:
    ggml_compute_forward_tanh(params_00,in_stack_ffffffffffffffd8);
    break;
  case (ggml_compute_params *)0x5:
    ggml_compute_forward_elu(params_00,in_stack_ffffffffffffffd8);
    break;
  case (ggml_compute_params *)0x6:
    ggml_compute_forward_relu(params_00,in_stack_ffffffffffffffd8);
    break;
  case (ggml_compute_params *)0x7:
    ggml_compute_forward_sigmoid(params_00,in_stack_ffffffffffffffd8);
    break;
  case (ggml_compute_params *)0x8:
    ggml_compute_forward_gelu(in_RSI,(ggml_tensor *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
    break;
  case (ggml_compute_params *)0x9:
    ggml_compute_forward_gelu_quick(in_RSI,(ggml_tensor *)CONCAT44(uVar1,in_stack_ffffffffffffffe8))
    ;
    break;
  case (ggml_compute_params *)0xa:
    ggml_compute_forward_silu(in_RSI,(ggml_tensor *)CONCAT44(uVar1,in_stack_ffffffffffffffe8));
    break;
  case (ggml_compute_params *)0xb:
    ggml_compute_forward_hardswish(params_00,in_stack_ffffffffffffffd8);
    break;
  case (ggml_compute_params *)0xc:
    ggml_compute_forward_hardsigmoid(params_00,in_stack_ffffffffffffffd8);
    break;
  case (ggml_compute_params *)0xd:
    ggml_compute_forward_exp(params_00,in_stack_ffffffffffffffd8);
    break;
  default:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1e6b,"fatal error");
  }
  return;
}

Assistant:

void ggml_compute_forward_unary(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_unary_op op = ggml_get_unary_op(dst);

    switch (op) {
        case GGML_UNARY_OP_ABS:
            {
                ggml_compute_forward_abs(params, dst);
            } break;
        case GGML_UNARY_OP_SGN:
            {
                ggml_compute_forward_sgn(params, dst);
            } break;
        case GGML_UNARY_OP_NEG:
            {
                ggml_compute_forward_neg(params, dst);
            } break;
        case GGML_UNARY_OP_STEP:
            {
                ggml_compute_forward_step(params, dst);
            } break;
        case GGML_UNARY_OP_TANH:
            {
                ggml_compute_forward_tanh(params, dst);
            } break;
        case GGML_UNARY_OP_ELU:
            {
                ggml_compute_forward_elu(params, dst);
            } break;
        case GGML_UNARY_OP_RELU:
            {
                ggml_compute_forward_relu(params, dst);
            } break;
        case GGML_UNARY_OP_SIGMOID:
            {
                ggml_compute_forward_sigmoid(params, dst);
            } break;
        case GGML_UNARY_OP_GELU:
            {
                ggml_compute_forward_gelu(params, dst);
            } break;
        case GGML_UNARY_OP_GELU_QUICK:
            {
                ggml_compute_forward_gelu_quick(params, dst);
            } break;
        case GGML_UNARY_OP_SILU:
            {
                ggml_compute_forward_silu(params, dst);
            } break;
        case GGML_UNARY_OP_HARDSWISH:
            {
                ggml_compute_forward_hardswish(params, dst);
            } break;
        case GGML_UNARY_OP_HARDSIGMOID:
            {
                ggml_compute_forward_hardsigmoid(params, dst);
            } break;
        case GGML_UNARY_OP_EXP:
            {
                ggml_compute_forward_exp(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}